

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall AstWalker::visitExpressionAstNode(AstWalker *this,ExpressionAstNode *node)

{
  long local_d8;
  BuiltInFunctionInvocationExpressionAstNode *local_c8;
  ObjectDeclarationExpressionAstNode *local_b8;
  FunctionDeclarationExpressionAstNode *local_a8;
  FunctionInvocationExpressionAstNode *local_98;
  IdentifierExpressionAstNode *local_88;
  allocator<char> local_69;
  string local_68;
  long local_48;
  BuiltInFunctionInvocationExpressionAstNode *builtInFn;
  ObjectDeclarationExpressionAstNode *objDef;
  FunctionDeclarationExpressionAstNode *fnDefine;
  FunctionInvocationExpressionAstNode *fnCall;
  IdentifierExpressionAstNode *identifier;
  LiteralExpressionAstNode *literal;
  ExpressionAstNode *node_local;
  AstWalker *this_local;
  
  literal = (LiteralExpressionAstNode *)node;
  node_local = (ExpressionAstNode *)this;
  if (node == (ExpressionAstNode *)0x0) {
    local_88 = (IdentifierExpressionAstNode *)0x0;
  }
  else {
    local_88 = (IdentifierExpressionAstNode *)
               __dynamic_cast(node,&ExpressionAstNode::typeinfo,&LiteralExpressionAstNode::typeinfo,
                              0);
  }
  identifier = local_88;
  if (local_88 == (IdentifierExpressionAstNode *)0x0) {
    if (literal == (LiteralExpressionAstNode *)0x0) {
      local_98 = (FunctionInvocationExpressionAstNode *)0x0;
    }
    else {
      local_98 = (FunctionInvocationExpressionAstNode *)
                 __dynamic_cast(literal,&ExpressionAstNode::typeinfo,
                                &IdentifierExpressionAstNode::typeinfo,0);
    }
    fnCall = local_98;
    if (local_98 == (FunctionInvocationExpressionAstNode *)0x0) {
      if (literal == (LiteralExpressionAstNode *)0x0) {
        local_a8 = (FunctionDeclarationExpressionAstNode *)0x0;
      }
      else {
        local_a8 = (FunctionDeclarationExpressionAstNode *)
                   __dynamic_cast(literal,&ExpressionAstNode::typeinfo,
                                  &FunctionInvocationExpressionAstNode::typeinfo,0);
      }
      fnDefine = local_a8;
      if (local_a8 == (FunctionDeclarationExpressionAstNode *)0x0) {
        if (literal == (LiteralExpressionAstNode *)0x0) {
          local_b8 = (ObjectDeclarationExpressionAstNode *)0x0;
        }
        else {
          local_b8 = (ObjectDeclarationExpressionAstNode *)
                     __dynamic_cast(literal,&ExpressionAstNode::typeinfo,
                                    &FunctionDeclarationExpressionAstNode::typeinfo,0);
        }
        objDef = local_b8;
        if (local_b8 == (ObjectDeclarationExpressionAstNode *)0x0) {
          if (literal == (LiteralExpressionAstNode *)0x0) {
            local_c8 = (BuiltInFunctionInvocationExpressionAstNode *)0x0;
          }
          else {
            local_c8 = (BuiltInFunctionInvocationExpressionAstNode *)
                       __dynamic_cast(literal,&ExpressionAstNode::typeinfo,
                                      &ObjectDeclarationExpressionAstNode::typeinfo,0);
          }
          builtInFn = local_c8;
          if (local_c8 == (BuiltInFunctionInvocationExpressionAstNode *)0x0) {
            if (literal == (LiteralExpressionAstNode *)0x0) {
              local_d8 = 0;
            }
            else {
              local_d8 = __dynamic_cast(literal,&ExpressionAstNode::typeinfo,
                                        &BuiltInFunctionInvocationExpressionAstNode::typeinfo,0);
            }
            local_48 = local_d8;
            if (local_d8 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_68,
                         "visitExpressionAstNode called with unexpected node type",&local_69);
              Error::assertWithPanic(false,&local_68);
              std::__cxx11::string::~string((string *)&local_68);
              std::allocator<char>::~allocator(&local_69);
            }
            else {
              (*this->_vptr_AstWalker[0xf])(this,local_d8);
            }
          }
          else {
            (*this->_vptr_AstWalker[0x11])(this,local_c8);
          }
        }
        else {
          (*this->_vptr_AstWalker[0x10])(this,local_b8);
        }
      }
      else {
        (*this->_vptr_AstWalker[0xe])(this,local_a8);
      }
    }
    else {
      (*this->_vptr_AstWalker[0xd])(this,local_98);
    }
  }
  else {
    (*this->_vptr_AstWalker[0xc])(this,local_88);
  }
  return;
}

Assistant:

void AstWalker::visitExpressionAstNode(ExpressionAstNode* node) noexcept {

  auto literal = dynamic_cast<LiteralExpressionAstNode*>(node);
  if (literal != nullptr) {
    this->visitLiteralExpressionAstNode(literal);
    return;
  }

  auto identifier = dynamic_cast<IdentifierExpressionAstNode*>(node);
  if (identifier != nullptr) {
    this->visitIdentifierExpressionAstNode(identifier);
    return;
  }

  auto fnCall = dynamic_cast<FunctionInvocationExpressionAstNode*>(node);
  if (fnCall != nullptr) {
    this->visitFunctionInvocationExpressionAstNode(fnCall);
    return;
  }

  auto fnDefine = dynamic_cast<FunctionDeclarationExpressionAstNode*>(node);
  if (fnDefine != nullptr) {
    this->visitFunctionDeclarationExpressionAstNode(fnDefine);
    return;
  }

  auto objDef = dynamic_cast<ObjectDeclarationExpressionAstNode*>(node);
  if (objDef != nullptr) {
    this->visitObjectDeclarationExpressionAstNode(objDef);
    return;
  }

  auto builtInFn = dynamic_cast<BuiltInFunctionInvocationExpressionAstNode*>(node);
  if (builtInFn != nullptr) {
    this->visitBuiltInFunctionInvocationExpressionAstNode(builtInFn);
    return;
  }

  Error::assertWithPanic(false, "visitExpressionAstNode called with unexpected node type");
}